

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::Warning(Parser *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->opts).no_warnings == false) {
    std::operator+(&local_30,"warning: ",msg);
    Message(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    this->has_warning_ = true;
  }
  return;
}

Assistant:

void Parser::Warning(const std::string &msg) {
  if (!opts.no_warnings) {
    Message("warning: " + msg);
    has_warning_ = true;  // for opts.warnings_as_errors
  }
}